

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>::reject
          (AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this,
          Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::Promise<void>_> local_1c0;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::Promise<void>_>::ExceptionOr(&local_1c0,false,exception_00);
    ExceptionOr<kj::Promise<void>_>::operator=(&this->result,&local_1c0);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_1c0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }